

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::PrepareProgram
          (AttributeBindingDivisorTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  undefined4 *puVar9;
  Enum<int,_2UL> EVar10;
  uint local_39c;
  undefined1 local_398 [4];
  GLuint i_2;
  char *local_218;
  GLchar *log_text_1;
  uint local_208;
  GLint log_size_1;
  GLuint i_1;
  GLint status;
  int local_1f8;
  Enum<int,_2UL> local_1f0;
  MessageBuilder local_1e0;
  char *local_60;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  undefined4 local_3c;
  undefined4 uStack_38;
  GLuint shader_count;
  Shader shader [2];
  Functions *gl;
  AttributeBindingDivisorTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  shader[1]._8_8_ = CONCAT44(extraout_var,iVar1);
  shader[0]._8_8_ = s_fragment_shader;
  shader[1].source = (GLchar *)0x8b30;
  uStack_38 = 0x2a73530;
  shader_count = 0;
  shader[0].source._0_4_ = 0x8b31;
  shader[0].source._4_4_ = 0;
  local_3c = 2;
  GVar2 = (**(code **)(shader[1]._8_8_ + 0x3c8))();
  this->m_po = GVar2;
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xc34);
  for (log_size = 0; (uint)log_size < 2; log_size = log_size + 1) {
    if (*(long *)((long)&stack0xffffffffffffffc8 + (ulong)(uint)log_size * 0x10) != 0) {
      uVar4 = (**(code **)(shader[1]._8_8_ + 0x3f0))(*(undefined4 *)&shader[(uint)log_size].source);
      *(undefined4 *)((long)&shader[(uint)log_size].source + 4) = uVar4;
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xc3e);
      (**(code **)(shader[1]._8_8_ + 0x10))
                (this->m_po,*(undefined4 *)((long)&shader[(uint)log_size].source + 4));
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xc42);
      (**(code **)(shader[1]._8_8_ + 0x12b8))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),1,
                 (undefined1 *)((long)&stack0xffffffffffffffc8 + (ulong)(uint)log_size * 0x10),0);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xc46);
      (**(code **)(shader[1]._8_8_ + 0x248))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4));
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xc4a);
      log_text._4_4_ = 0;
      (**(code **)(shader[1]._8_8_ + 0xa70))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),0x8b81,
                 (long)&log_text + 4);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xc4f);
      if (log_text._4_4_ == 0) {
        log_text._0_4_ = 0;
        (**(code **)(shader[1]._8_8_ + 0xa70))
                  (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),0x8b84,&log_text);
        dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar3,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0xc55);
        local_60 = (char *)operator_new__((long)(int)log_text);
        (**(code **)(shader[1]._8_8_ + 0xa58))
                  (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),(int)log_text,0,
                   local_60);
        pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<(&local_1e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_1e0,(char (*) [32])"Shader compilation has failed.\n");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"Shader type: ");
        EVar10 = glu::getShaderTypeStr(*(int *)&shader[(uint)log_size].source);
        _i_1 = EVar10.m_getName;
        local_1f8 = EVar10.m_value;
        local_1f0.m_getName = _i_1;
        local_1f0.m_value = local_1f8;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [31])"Shader compilation error log:\n");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_60);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])"Shader source code:\n");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char **)((long)&stack0xffffffffffffffc8 +
                                            (ulong)(uint)log_size * 0x10));
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e0);
        if (local_60 != (char *)0x0) {
          operator_delete__(local_60);
        }
        dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar3,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0xc66);
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&int::typeinfo,0);
      }
    }
  }
  (**(code **)(shader[1]._8_8_ + 0x14c8))(this->m_po,1,&PrepareProgram::xfb_varying,0x8c8c);
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xc71);
  (**(code **)(shader[1]._8_8_ + 0xce8))(this->m_po);
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xc76);
  log_size_1 = 0;
  (**(code **)(shader[1]._8_8_ + 0x9d8))(this->m_po,0x8b82,&log_size_1);
  if (log_size_1 == 1) {
    for (local_208 = 0; local_208 < 2; local_208 = local_208 + 1) {
      if (*(int *)((long)&shader[local_208].source + 4) != 0) {
        (**(code **)(shader[1]._8_8_ + 0x4e0))
                  (this->m_po,*(undefined4 *)((long)&shader[local_208].source + 4));
        dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar3,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0xc84);
      }
    }
    for (local_39c = 0; local_39c < 2; local_39c = local_39c + 1) {
      if (*(int *)((long)&shader[local_39c].source + 4) != 0) {
        (**(code **)(shader[1]._8_8_ + 0x470))(*(undefined4 *)((long)&shader[local_39c].source + 4))
        ;
        *(undefined4 *)((long)&shader[local_39c].source + 4) = 0;
      }
    }
    if (this->m_po != 0) {
      (**(code **)(shader[1]._8_8_ + 0x1680))(this->m_po);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0xcb6);
    }
    if (this->m_po != 0) {
      return;
    }
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  log_text_1._4_4_ = 0;
  (**(code **)(shader[1]._8_8_ + 0x9d8))(this->m_po,0x8b84,(long)&log_text_1 + 4);
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xc8e);
  local_218 = (char *)operator_new__((long)log_text_1._4_4_);
  (**(code **)(shader[1]._8_8_ + 0x988))(this->m_po,log_text_1._4_4_,0,local_218);
  pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_398,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_398,
                      (char (*) [36])"Program linkage has failed due to:\n");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_218);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_398);
  if (local_218 != (char *)0x0) {
    operator_delete__(local_218);
  }
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xc9a);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

void AttributeBindingDivisorTest::PrepareProgram()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Transform Feedback setup. */
		static const glw::GLchar* xfb_varying = "result";

		gl.transformFeedbackVaryings(m_po, 1, &xfb_varying, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (m_po)
	{
		gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");
	}

	if (0 == m_po)
	{
		throw 0;
	}
}